

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax.cpp
# Opt level: O1

void duckdb::MinOperation::Execute<duckdb::interval_t,duckdb::MinMaxState<duckdb::interval_t>>
               (MinMaxState<duckdb::interval_t> *state,interval_t input,AggregateInputData *param_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  lVar2 = input.micros;
  lVar4 = input._0_8_;
  lVar1 = (state->value).micros;
  lVar6 = (long)(state->value).days + lVar1 / 86400000000;
  lVar3 = lVar6 % 0x1e;
  lVar7 = (long)(state->value).months + lVar6 / 0x1e;
  lVar5 = (lVar4 >> 0x20) + lVar2 / 86400000000;
  lVar6 = lVar5 % 0x1e;
  lVar5 = (long)input.months + lVar5 / 0x1e;
  if ((lVar5 < lVar7) ||
     ((lVar5 <= lVar7 &&
      ((lVar6 < lVar3 || ((lVar6 <= lVar3 && (lVar2 % 86400000000 < lVar1 % 86400000000)))))))) {
    (state->value).months = (int)lVar4;
    (state->value).days = (int)((ulong)lVar4 >> 0x20);
    (state->value).micros = lVar2;
  }
  return;
}

Assistant:

static void Execute(STATE &state, INPUT_TYPE input, AggregateInputData &) {
		if (LessThan::Operation<INPUT_TYPE>(input, state.value)) {
			state.value = input;
		}
	}